

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O3

void xmlFAParseCharProp(xmlRegParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  byte bVar2;
  xmlChar *pxVar3;
  byte *pbVar4;
  xmlRegAtomPtr pxVar5;
  xmlRegAtomType type;
  int len;
  char *extra;
  xmlChar *blockName;
  
  pxVar3 = ctxt->cur;
  switch(*pxVar3) {
  case 'C':
    ctxt->cur = pxVar3 + 1;
    bVar2 = pxVar3[1];
    type = XML_REGEXP_OTHER;
    blockName = (xmlChar *)0x0;
    if (bVar2 < 0x6e) {
      if (bVar2 == 99) {
        ctxt->cur = pxVar3 + 2;
        type = XML_REGEXP_OTHER_CONTROL;
      }
      else {
        if (bVar2 != 0x66) goto switchD_001a5d85_caseD_1;
        ctxt->cur = pxVar3 + 2;
        type = XML_REGEXP_OTHER_FORMAT;
      }
    }
    else if (bVar2 == 0x6e) {
      ctxt->cur = pxVar3 + 2;
      type = XML_REGEXP_OTHER_NA;
    }
    else {
      if (bVar2 != 0x6f) goto switchD_001a5d85_caseD_1;
      ctxt->cur = pxVar3 + 2;
      type = XML_REGEXP_OTHER_PRIVATE;
    }
    break;
  case 'D':
  case 'E':
  case 'F':
  case 'G':
  case 'H':
  case 'J':
  case 'K':
  case 'O':
  case 'Q':
  case 'R':
switchD_001a5cbf_caseD_44:
    ctxt->error = 0x5aa;
    extra = "Unknown char property";
LAB_001a5f18:
    xmlRegexpErrCompile(ctxt,extra);
    return;
  case 'I':
    ctxt->cur = pxVar3 + 1;
    if (pxVar3[1] != 's') {
      ctxt->error = 0x5aa;
      extra = "IsXXXX expected";
      goto LAB_001a5f18;
    }
    ctxt->cur = pxVar3 + 2;
    bVar2 = pxVar3[2];
    if (((byte)((bVar2 & 0xdf) + 0xbf) < 0x1a) || (bVar2 == 0x2d || (byte)(bVar2 - 0x30) < 10)) {
      pbVar4 = pxVar3 + 3;
      len = 1;
      while( true ) {
        ctxt->cur = pbVar4;
        bVar2 = *pbVar4;
        if ((0x19 < (byte)((bVar2 & 0xdf) + 0xbf)) && (bVar2 != 0x2d && 9 < (byte)(bVar2 - 0x30)))
        break;
        len = len + 1;
        pbVar4 = pbVar4 + 1;
      }
    }
    else {
      len = 0;
    }
    blockName = xmlStrndup(pxVar3 + 2,len);
    type = XML_REGEXP_BLOCK_NAME;
    goto switchD_001a5d85_caseD_1;
  case 'L':
    ctxt->cur = pxVar3 + 1;
    type = XML_REGEXP_LETTER;
    blockName = (xmlChar *)0x0;
    switch(pxVar3[1]) {
    case 'l':
      ctxt->cur = pxVar3 + 2;
      type = XML_REGEXP_LETTER_LOWERCASE;
      break;
    case 'm':
      ctxt->cur = pxVar3 + 2;
      type = XML_REGEXP_LETTER_MODIFIER;
      break;
    default:
      goto switchD_001a5d85_caseD_1;
    case 'o':
      ctxt->cur = pxVar3 + 2;
      type = XML_REGEXP_LETTER_OTHERS;
      break;
    case 't':
      ctxt->cur = pxVar3 + 2;
      type = XML_REGEXP_LETTER_TITLECASE;
      break;
    case 'u':
      ctxt->cur = pxVar3 + 2;
      type = XML_REGEXP_LETTER_UPPERCASE;
    }
    break;
  case 'M':
    ctxt->cur = pxVar3 + 1;
    xVar1 = pxVar3[1];
    if (xVar1 == 'c') {
      ctxt->cur = pxVar3 + 2;
      type = XML_REGEXP_MARK_SPACECOMBINING;
    }
    else if (xVar1 == 'e') {
      ctxt->cur = pxVar3 + 2;
      type = XML_REGEXP_MARK_ENCLOSING;
    }
    else {
      if (xVar1 != 'n') {
        blockName = (xmlChar *)0x0;
        type = XML_REGEXP_MARK;
        goto switchD_001a5d85_caseD_1;
      }
      ctxt->cur = pxVar3 + 2;
      type = XML_REGEXP_MARK_NONSPACING;
    }
    break;
  case 'N':
    ctxt->cur = pxVar3 + 1;
    xVar1 = pxVar3[1];
    if (xVar1 == 'o') {
      ctxt->cur = pxVar3 + 2;
      type = XML_REGEXP_NUMBER_OTHERS;
    }
    else if (xVar1 == 'l') {
      ctxt->cur = pxVar3 + 2;
      type = XML_REGEXP_NUMBER_LETTER;
    }
    else {
      if (xVar1 != 'd') {
        blockName = (xmlChar *)0x0;
        type = XML_REGEXP_NUMBER;
        goto switchD_001a5d85_caseD_1;
      }
      ctxt->cur = pxVar3 + 2;
      type = XML_REGEXP_NUMBER_DECIMAL;
    }
    break;
  case 'P':
    ctxt->cur = pxVar3 + 1;
    type = XML_REGEXP_PUNCT;
    blockName = (xmlChar *)0x0;
    switch(pxVar3[1]) {
    case 'c':
      ctxt->cur = pxVar3 + 2;
      type = XML_REGEXP_PUNCT_CONNECTOR;
      break;
    case 'd':
      ctxt->cur = pxVar3 + 2;
      type = XML_REGEXP_PUNCT_DASH;
      break;
    case 'e':
      ctxt->cur = pxVar3 + 2;
      type = XML_REGEXP_PUNCT_CLOSE;
      break;
    case 'f':
      ctxt->cur = pxVar3 + 2;
      type = XML_REGEXP_PUNCT_FINQUOTE;
      break;
    default:
      goto switchD_001a5d85_caseD_1;
    case 'i':
      ctxt->cur = pxVar3 + 2;
      type = XML_REGEXP_PUNCT_INITQUOTE;
      break;
    case 'o':
      ctxt->cur = pxVar3 + 2;
      type = XML_REGEXP_PUNCT_OTHERS;
      break;
    case 's':
      ctxt->cur = pxVar3 + 2;
      type = XML_REGEXP_PUNCT_OPEN;
    }
    break;
  case 'S':
    ctxt->cur = pxVar3 + 1;
    type = XML_REGEXP_SYMBOL;
    blockName = (xmlChar *)0x0;
    switch((byte)(pxVar3[1] + 0x9d) >> 1 | (pxVar3[1] + 0x9d) * -0x80) {
    case 0:
      ctxt->cur = pxVar3 + 2;
      type = XML_REGEXP_SYMBOL_CURRENCY;
      break;
    default:
      goto switchD_001a5d85_caseD_1;
    case 4:
      ctxt->cur = pxVar3 + 2;
      type = XML_REGEXP_SYMBOL_MODIFIER;
      break;
    case 5:
      ctxt->cur = pxVar3 + 2;
      type = XML_REGEXP_SYMBOL_MATH;
      break;
    case 6:
      ctxt->cur = pxVar3 + 2;
      type = XML_REGEXP_SYMBOL_OTHERS;
    }
    break;
  default:
    if (*pxVar3 != 'Z') goto switchD_001a5cbf_caseD_44;
    ctxt->cur = pxVar3 + 1;
    xVar1 = pxVar3[1];
    if (xVar1 == 'l') {
      ctxt->cur = pxVar3 + 2;
      type = XML_REGEXP_SEPAR_LINE;
    }
    else if (xVar1 == 'p') {
      ctxt->cur = pxVar3 + 2;
      type = XML_REGEXP_SEPAR_PARA;
    }
    else {
      if (xVar1 != 's') {
        blockName = (xmlChar *)0x0;
        type = XML_REGEXP_SEPAR;
        goto switchD_001a5d85_caseD_1;
      }
      ctxt->cur = pxVar3 + 2;
      type = XML_REGEXP_SEPAR_SPACE;
    }
  }
  blockName = (xmlChar *)0x0;
switchD_001a5d85_caseD_1:
  pxVar5 = ctxt->atom;
  if (pxVar5 == (xmlRegAtomPtr)0x0) {
    pxVar5 = (xmlRegAtomPtr)(*xmlMalloc)(0x60);
    if (pxVar5 == (xmlRegAtomPtr)0x0) {
      xmlRegexpErrMemory(ctxt,"allocating atom");
      ctxt->atom = (xmlRegAtomPtr)0x0;
    }
    else {
      pxVar5->no = 0;
      pxVar5->type = 0;
      pxVar5->quant = 0;
      pxVar5->min = 0;
      pxVar5->ranges = (xmlRegRangePtr *)0x0;
      pxVar5->data = (void *)0x0;
      pxVar5->stop = (xmlRegStatePtr)0x0;
      pxVar5->maxRanges = 0;
      pxVar5->nbRanges = 0;
      pxVar5->start = (xmlRegStatePtr)0x0;
      pxVar5->start0 = (xmlRegStatePtr)0x0;
      pxVar5->valuep2 = (void *)0x0;
      pxVar5->neg = 0;
      pxVar5->codepoint = 0;
      *(undefined8 *)&pxVar5->max = 0;
      pxVar5->valuep = (void *)0x0;
      pxVar5->type = type;
      pxVar5->quant = XML_REGEXP_QUANT_ONCE;
      ctxt->atom = pxVar5;
      pxVar5->valuep = blockName;
    }
  }
  else if (pxVar5->type == XML_REGEXP_RANGES) {
    xmlRegAtomAddRange(ctxt,pxVar5,ctxt->neg,type,0,0,blockName);
  }
  return;
}

Assistant:

static void
xmlFAParseCharProp(xmlRegParserCtxtPtr ctxt) {
    int cur;
    xmlRegAtomType type = (xmlRegAtomType) 0;
    xmlChar *blockName = NULL;

    cur = CUR;
    if (cur == 'L') {
	NEXT;
	cur = CUR;
	if (cur == 'u') {
	    NEXT;
	    type = XML_REGEXP_LETTER_UPPERCASE;
	} else if (cur == 'l') {
	    NEXT;
	    type = XML_REGEXP_LETTER_LOWERCASE;
	} else if (cur == 't') {
	    NEXT;
	    type = XML_REGEXP_LETTER_TITLECASE;
	} else if (cur == 'm') {
	    NEXT;
	    type = XML_REGEXP_LETTER_MODIFIER;
	} else if (cur == 'o') {
	    NEXT;
	    type = XML_REGEXP_LETTER_OTHERS;
	} else {
	    type = XML_REGEXP_LETTER;
	}
    } else if (cur == 'M') {
	NEXT;
	cur = CUR;
	if (cur == 'n') {
	    NEXT;
	    /* nonspacing */
	    type = XML_REGEXP_MARK_NONSPACING;
	} else if (cur == 'c') {
	    NEXT;
	    /* spacing combining */
	    type = XML_REGEXP_MARK_SPACECOMBINING;
	} else if (cur == 'e') {
	    NEXT;
	    /* enclosing */
	    type = XML_REGEXP_MARK_ENCLOSING;
	} else {
	    /* all marks */
	    type = XML_REGEXP_MARK;
	}
    } else if (cur == 'N') {
	NEXT;
	cur = CUR;
	if (cur == 'd') {
	    NEXT;
	    /* digital */
	    type = XML_REGEXP_NUMBER_DECIMAL;
	} else if (cur == 'l') {
	    NEXT;
	    /* letter */
	    type = XML_REGEXP_NUMBER_LETTER;
	} else if (cur == 'o') {
	    NEXT;
	    /* other */
	    type = XML_REGEXP_NUMBER_OTHERS;
	} else {
	    /* all numbers */
	    type = XML_REGEXP_NUMBER;
	}
    } else if (cur == 'P') {
	NEXT;
	cur = CUR;
	if (cur == 'c') {
	    NEXT;
	    /* connector */
	    type = XML_REGEXP_PUNCT_CONNECTOR;
	} else if (cur == 'd') {
	    NEXT;
	    /* dash */
	    type = XML_REGEXP_PUNCT_DASH;
	} else if (cur == 's') {
	    NEXT;
	    /* open */
	    type = XML_REGEXP_PUNCT_OPEN;
	} else if (cur == 'e') {
	    NEXT;
	    /* close */
	    type = XML_REGEXP_PUNCT_CLOSE;
	} else if (cur == 'i') {
	    NEXT;
	    /* initial quote */
	    type = XML_REGEXP_PUNCT_INITQUOTE;
	} else if (cur == 'f') {
	    NEXT;
	    /* final quote */
	    type = XML_REGEXP_PUNCT_FINQUOTE;
	} else if (cur == 'o') {
	    NEXT;
	    /* other */
	    type = XML_REGEXP_PUNCT_OTHERS;
	} else {
	    /* all punctuation */
	    type = XML_REGEXP_PUNCT;
	}
    } else if (cur == 'Z') {
	NEXT;
	cur = CUR;
	if (cur == 's') {
	    NEXT;
	    /* space */
	    type = XML_REGEXP_SEPAR_SPACE;
	} else if (cur == 'l') {
	    NEXT;
	    /* line */
	    type = XML_REGEXP_SEPAR_LINE;
	} else if (cur == 'p') {
	    NEXT;
	    /* paragraph */
	    type = XML_REGEXP_SEPAR_PARA;
	} else {
	    /* all separators */
	    type = XML_REGEXP_SEPAR;
	}
    } else if (cur == 'S') {
	NEXT;
	cur = CUR;
	if (cur == 'm') {
	    NEXT;
	    type = XML_REGEXP_SYMBOL_MATH;
	    /* math */
	} else if (cur == 'c') {
	    NEXT;
	    type = XML_REGEXP_SYMBOL_CURRENCY;
	    /* currency */
	} else if (cur == 'k') {
	    NEXT;
	    type = XML_REGEXP_SYMBOL_MODIFIER;
	    /* modifiers */
	} else if (cur == 'o') {
	    NEXT;
	    type = XML_REGEXP_SYMBOL_OTHERS;
	    /* other */
	} else {
	    /* all symbols */
	    type = XML_REGEXP_SYMBOL;
	}
    } else if (cur == 'C') {
	NEXT;
	cur = CUR;
	if (cur == 'c') {
	    NEXT;
	    /* control */
	    type = XML_REGEXP_OTHER_CONTROL;
	} else if (cur == 'f') {
	    NEXT;
	    /* format */
	    type = XML_REGEXP_OTHER_FORMAT;
	} else if (cur == 'o') {
	    NEXT;
	    /* private use */
	    type = XML_REGEXP_OTHER_PRIVATE;
	} else if (cur == 'n') {
	    NEXT;
	    /* not assigned */
	    type = XML_REGEXP_OTHER_NA;
	} else {
	    /* all others */
	    type = XML_REGEXP_OTHER;
	}
    } else if (cur == 'I') {
	const xmlChar *start;
	NEXT;
	cur = CUR;
	if (cur != 's') {
	    ERROR("IsXXXX expected");
	    return;
	}
	NEXT;
	start = ctxt->cur;
	cur = CUR;
	if (((cur >= 'a') && (cur <= 'z')) ||
	    ((cur >= 'A') && (cur <= 'Z')) ||
	    ((cur >= '0') && (cur <= '9')) ||
	    (cur == 0x2D)) {
	    NEXT;
	    cur = CUR;
	    while (((cur >= 'a') && (cur <= 'z')) ||
		((cur >= 'A') && (cur <= 'Z')) ||
		((cur >= '0') && (cur <= '9')) ||
		(cur == 0x2D)) {
		NEXT;
		cur = CUR;
	    }
	}
	type = XML_REGEXP_BLOCK_NAME;
	blockName = xmlStrndup(start, ctxt->cur - start);
    } else {
	ERROR("Unknown char property");
	return;
    }
    if (ctxt->atom == NULL) {
	ctxt->atom = xmlRegNewAtom(ctxt, type);
	if (ctxt->atom != NULL)
	    ctxt->atom->valuep = blockName;
    } else if (ctxt->atom->type == XML_REGEXP_RANGES) {
        xmlRegAtomAddRange(ctxt, ctxt->atom, ctxt->neg,
		           type, 0, 0, blockName);
    }
}